

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogt_vox.h
# Opt level: O0

void compute_scene_used_color_index_mask(bool *used_mask,ogt_vox_scene *scene)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  ogt_vox_model *poVar4;
  uint local_30;
  uint8_t color_index;
  uint32_t voxel_index;
  uint32_t voxel_count;
  ogt_vox_model *model;
  uint32_t model_index;
  ogt_vox_scene *scene_local;
  bool *used_mask_local;
  
  memset(used_mask,0,0x100);
  for (model._4_4_ = 0; model._4_4_ < scene->num_models; model._4_4_ = model._4_4_ + 1) {
    poVar4 = scene->models[model._4_4_];
    uVar1 = poVar4->size_x;
    uVar2 = poVar4->size_y;
    uVar3 = poVar4->size_z;
    for (local_30 = 0; local_30 < uVar1 * uVar2 * uVar3; local_30 = local_30 + 1) {
      used_mask[poVar4->voxel_data[local_30]] = true;
    }
  }
  return;
}

Assistant:

static void compute_scene_used_color_index_mask(bool* used_mask, const ogt_vox_scene * scene) {
        memset(used_mask, 0, 256);
        for (uint32_t model_index = 0; model_index < scene->num_models; model_index++) {
            const ogt_vox_model* model = scene->models[model_index];
            uint32_t voxel_count = model->size_x * model->size_y * model->size_z;
            for (uint32_t voxel_index = 0; voxel_index < voxel_count; voxel_index++) {
                uint8_t color_index = model->voxel_data[voxel_index];
                used_mask[color_index] = true;
            }
        }
    }